

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser_invalidVariableAttributesAndGetVariableIssue_Test::
~Parser_invalidVariableAttributesAndGetVariableIssue_Test
          (Parser_invalidVariableAttributesAndGetVariableIssue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, invalidVariableAttributesAndGetVariableIssue)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"\">\n"
        "  <component name=\"componentA\">\n"
        "    <variable name=\"quixote\" don=\"true\"/>\n"
        "    <variable name=\"\" units=\"\" windmill=\"tilted\"/>\n"
        "    <variable units=\"bobs\"/>\n"
        "  </component>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Variable 'quixote' has an invalid attribute 'don'.",
        "Variable 'quixote' does not specify a units attribute.",
        "Variable '' has an invalid attribute 'windmill'.",
        "Variable with units 'bobs' does not specify a name attribute.",
        "Model does not contain the units '' required by variable '' in component 'componentA'.",
        "Model does not contain the units 'bobs' required by variable '' in component 'componentA'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);

    libcellml::VariablePtr variableExpected = model->component("componentA")->variable("quixote");
    // Get variable from issue and check.
    EXPECT_EQ(variableExpected, p->issue(0)->item()->variable());
    // Get const variable from issue and check.
    libcellml::IssuePtr issue = p->issue(0);
    libcellml::Issue *rawIssue = issue.get();
    const libcellml::VariablePtr variableFromIssue = rawIssue->item()->variable();
    EXPECT_EQ(variableExpected, variableFromIssue);
}